

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_GeneratorAndPlugin_DescriptorSetIn_Test::TestBody
          (CommandLineInterfaceTest_GeneratorAndPlugin_DescriptorSetIn_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  void *pvVar5;
  Arena *pAVar6;
  string_view value;
  string_view value_00;
  string_view filename;
  FileDescriptorSet file_descriptor_set;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_70 [72];
  
  FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_70,(Arena *)0x0);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_70 + 0x28),
                      Arena::DefaultConstruct<google::protobuf::FileDescriptorProto>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value._M_str = "foo.proto";
  value._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 200),value,pAVar6);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar5 + 0x30),
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_00._M_str = "Foo";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0xd8),value_00,pAVar6);
  filename._M_str = "foo.bin";
  filename._M_len = 7;
  CommandLineInterfaceTest::WriteDescriptorSet
            (&this->super_CommandLineInterfaceTest,filename,(FileDescriptorSet *)local_70);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "protocol_compiler --test_out=$tmpdir --plug_out=$tmpdir --descriptor_set_in=$tmpdir/foo.bin foo.proto"
             ,"");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"test_generator","");
  paVar2 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,anon_var_dwarf_a12c75 + 5);
  paVar3 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"foo.proto","");
  paVar4 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Foo","");
  CommandLineInterfaceTest::ExpectGenerated
            (&this->super_CommandLineInterfaceTest,&local_b0,&local_d0,&local_f0,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar4) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"test_plugin","");
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,anon_var_dwarf_a12c75 + 5);
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"foo.proto","");
  local_110._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Foo","");
  CommandLineInterfaceTest::ExpectGenerated
            (&this->super_CommandLineInterfaceTest,&local_b0,&local_d0,&local_f0,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar4) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_70);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, GeneratorAndPlugin_DescriptorSetIn) {
  // Invoke a generator and a plugin at the same time.

  FileDescriptorSet file_descriptor_set;
  FileDescriptorProto* file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("foo.proto");
  file_descriptor_proto->add_message_type()->set_name("Foo");

  WriteDescriptorSet("foo.bin", &file_descriptor_set);

  Run("protocol_compiler --test_out=$tmpdir --plug_out=$tmpdir "
      "--descriptor_set_in=$tmpdir/foo.bin foo.proto");

  ExpectNoErrors();
  ExpectGenerated("test_generator", "", "foo.proto", "Foo");
  ExpectGenerated("test_plugin", "", "foo.proto", "Foo");
}